

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

bool HasTestOption(ArgsManager *args,string *test_option)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider __s2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  pointer pbVar6;
  pointer pbVar7;
  pointer pbVar8;
  pointer pbVar9;
  long in_FS_OFFSET;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  long *local_f8;
  long local_f0;
  long local_e8 [2];
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  long *local_98;
  long local_90;
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68 [2];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-test","");
  ArgsManager::GetArgs(&local_110,args,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_f8 = local_e8;
  pcVar2 = (test_option->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar2,pcVar2 + test_option->_M_string_length);
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_f8,local_f0 + (long)local_f8);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_d8,local_d0 + (long)local_d8);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_b8,local_b0 + (long)local_b8);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_98,local_90 + (long)local_98);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_58._M_dataplus._M_p,
             local_58._M_dataplus._M_p + local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_78,local_70 + (long)local_78);
  __s2._M_p = local_58._M_dataplus._M_p;
  uVar4 = (long)local_110.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_110.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = local_110.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (long)uVar4 >> 7) {
    pbVar7 = (pointer)((long)&((local_110.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      (uVar4 & 0xffffffffffffff80));
    lVar5 = ((long)uVar4 >> 7) + 1;
    pbVar8 = local_110.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2;
    pbVar6 = local_110.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pbVar8[-2]._M_string_length == local_58._M_string_length) {
        if (local_58._M_string_length == 0) {
          pbVar9 = pbVar8 + -2;
          goto LAB_00337c20;
        }
        iVar3 = bcmp(pbVar8[-2]._M_dataplus._M_p,__s2._M_p,local_58._M_string_length);
        pbVar9 = pbVar6;
        if (iVar3 == 0) goto LAB_00337c20;
        if (pbVar8[-1]._M_string_length == local_58._M_string_length) {
          pbVar9 = pbVar8 + -1;
          goto LAB_00337ad9;
        }
      }
      else if (pbVar8[-1]._M_string_length == local_58._M_string_length) {
        if (local_58._M_string_length == 0) {
          pbVar9 = pbVar8 + -1;
          goto LAB_00337c20;
        }
        pbVar9 = pbVar6 + 1;
LAB_00337ad9:
        iVar3 = bcmp((pbVar9->_M_dataplus)._M_p,__s2._M_p,local_58._M_string_length);
        if (iVar3 == 0) goto LAB_00337c20;
      }
      if (pbVar8->_M_string_length == local_58._M_string_length) {
        pbVar9 = pbVar8;
        if ((local_58._M_string_length == 0) ||
           (iVar3 = bcmp((pbVar8->_M_dataplus)._M_p,__s2._M_p,local_58._M_string_length), iVar3 == 0
           )) goto LAB_00337c20;
        if (pbVar8[1]._M_string_length == local_58._M_string_length) {
          pbVar9 = pbVar8 + 1;
          goto LAB_00337b35;
        }
      }
      else if (pbVar8[1]._M_string_length == local_58._M_string_length) {
        if (local_58._M_string_length == 0) {
          pbVar9 = pbVar8 + 1;
          goto LAB_00337c20;
        }
        pbVar9 = pbVar6 + 3;
LAB_00337b35:
        iVar3 = bcmp((pbVar9->_M_dataplus)._M_p,__s2._M_p,local_58._M_string_length);
        if (iVar3 == 0) goto LAB_00337c20;
      }
      pbVar6 = pbVar6 + 4;
      lVar5 = lVar5 + -1;
      pbVar8 = pbVar8 + 4;
    } while (1 < lVar5);
    uVar4 = (long)local_110.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7;
  }
  lVar5 = (long)uVar4 >> 5;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pbVar9 = local_110.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((lVar5 != 3) ||
         ((pbVar7->_M_string_length == local_58._M_string_length &&
          ((pbVar9 = pbVar7, local_58._M_string_length == 0 ||
           (iVar3 = bcmp((pbVar7->_M_dataplus)._M_p,__s2._M_p,local_58._M_string_length), iVar3 == 0
           )))))) goto LAB_00337c20;
      pbVar7 = pbVar7 + 1;
    }
    if ((pbVar7->_M_string_length == local_58._M_string_length) &&
       ((pbVar9 = pbVar7, local_58._M_string_length == 0 ||
        (iVar3 = bcmp((pbVar7->_M_dataplus)._M_p,__s2._M_p,local_58._M_string_length), iVar3 == 0)))
       ) goto LAB_00337c20;
    pbVar7 = pbVar7 + 1;
  }
  pbVar9 = local_110.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((pbVar7->_M_string_length == local_58._M_string_length) &&
      (pbVar9 = pbVar7, local_58._M_string_length != 0)) &&
     (iVar3 = bcmp((pbVar7->_M_dataplus)._M_p,__s2._M_p,local_58._M_string_length), iVar3 != 0)) {
    pbVar9 = local_110.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
LAB_00337c20:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s2._M_p != &local_58.field_2) {
    operator_delete(__s2._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pbVar9 != local_110.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool HasTestOption(const ArgsManager& args, const std::string& test_option)
{
    const auto options = args.GetArgs("-test");
    return std::any_of(options.begin(), options.end(), [test_option](const auto& option) {
        return option == test_option;
    });
}